

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O1

void goodform::json::stringify_array(any *v,ostream *output)

{
  vector<std::any,_std::allocator<std::any>_> *pvVar1;
  pointer v_00;
  
  std::__ostream_insert<char,std::char_traits<char>>(output,"[",1);
  pvVar1 = get<std::vector<std::any,std::allocator<std::any>>>(v);
  v_00 = (pvVar1->super__Vector_base<std::any,_std::allocator<std::any>_>)._M_impl.
         super__Vector_impl_data._M_start;
  pvVar1 = get<std::vector<std::any,std::allocator<std::any>>>(v);
  if (v_00 != (pvVar1->super__Vector_base<std::any,_std::allocator<std::any>_>)._M_impl.
              super__Vector_impl_data._M_finish) {
    do {
      pvVar1 = get<std::vector<std::any,std::allocator<std::any>>>(v);
      if (v_00 != (pvVar1->super__Vector_base<std::any,_std::allocator<std::any>_>)._M_impl.
                  super__Vector_impl_data._M_start) {
        std::__ostream_insert<char,std::char_traits<char>>(output,",",1);
      }
      serialize(v_00,output);
      v_00 = v_00 + 1;
      pvVar1 = get<std::vector<std::any,std::allocator<std::any>>>(v);
    } while (v_00 != (pvVar1->super__Vector_base<std::any,_std::allocator<std::any>_>)._M_impl.
                     super__Vector_impl_data._M_finish);
  }
  std::__ostream_insert<char,std::char_traits<char>>(output,"]",1);
  return;
}

Assistant:

void json::stringify_array(const any& v, std::ostream& output)
  {
    output << "[";
    for (auto it = get<goodform::array_t>(v).begin(); it != get<goodform::array_t>(v).end(); ++it)
    {

      if (it != get<goodform::array_t>(v).begin())
        output << ",";
      serialize(*it, output);
    }
    output << "]";
  }